

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O0

MPI_Datatype
mxx::datatype_builder<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>::get_type(void)

{
  long lVar1;
  ompi_datatype_t *poVar2;
  bool bVar3;
  pointer ppVar4;
  reference pvVar5;
  reference ppoVar6;
  undefined8 local_b8;
  MPI_Datatype struct_type;
  _Self local_a8;
  iterator it;
  size_t i;
  array<ompi_datatype_t_*,_3UL> mpitypes;
  array<long,_3UL> displs;
  undefined1 local_58 [8];
  map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  members;
  size_t i_1;
  int blocklen [3];
  MPI_Datatype _type;
  
  for (members._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      members._M_t._M_impl.super__Rb_tree_header._M_node_count < 3;
      members._M_t._M_impl.super__Rb_tree_header._M_node_count =
           members._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    *(undefined4 *)((long)&i_1 + members._M_t._M_impl.super__Rb_tree_header._M_node_count * 4 + 4) =
         1;
  }
  std::
  map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  ::map((map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
         *)local_58);
  tuple_members<3UL,_3UL,_unsigned_long,_unsigned_long,_unsigned_long>::get
            ((map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
              *)local_58);
  it._M_node = (_Base_ptr)0x0;
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
       ::begin((map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
                *)local_58);
  while( true ) {
    struct_type = (MPI_Datatype)
                  std::
                  map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
                  ::end((map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
                         *)local_58);
    bVar3 = std::operator!=(&local_a8,(_Self *)&struct_type);
    if (!bVar3) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_ompi_datatype_t_*>_>::operator->
                       (&local_a8);
    lVar1 = ppVar4->first;
    pvVar5 = std::array<long,_3UL>::operator[]
                       ((array<long,_3UL> *)(mpitypes._M_elems + 2),(size_type)it._M_node);
    *pvVar5 = lVar1;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_ompi_datatype_t_*>_>::operator->
                       (&local_a8);
    poVar2 = ppVar4->second;
    ppoVar6 = std::array<ompi_datatype_t_*,_3UL>::operator[]
                        ((array<ompi_datatype_t_*,_3UL> *)&i,(size_type)it._M_node);
    *ppoVar6 = poVar2;
    it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
    std::_Rb_tree_iterator<std::pair<const_long,_ompi_datatype_t_*>_>::operator++(&local_a8);
  }
  pvVar5 = std::array<long,_3UL>::operator[]((array<long,_3UL> *)(mpitypes._M_elems + 2),0);
  ppoVar6 = std::array<ompi_datatype_t_*,_3UL>::operator[]((array<ompi_datatype_t_*,_3UL> *)&i,0);
  MPI_Type_create_struct(3,(long)&i_1 + 4,pvVar5,ppoVar6,&local_b8);
  MPI_Type_create_resized(local_b8,0,0x18,blocklen + 1);
  MPI_Type_commit(blocklen + 1);
  MPI_Type_free(&local_b8);
  std::
  map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  ::~map((map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
          *)local_58);
  return (MPI_Datatype)blocklen._4_8_;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;
        // fill in the block lengths to 1 each
        int blocklen[size];
        for (std::size_t i = 0; i < size; ++i) {
            blocklen[i] = 1;
        }

        // get the member displacement and type info for the tuple using
        // meta-recursion
        std::map<MPI_Aint, MPI_Datatype> members;
        tuple_members<size,size,Types...>::get(members);


        // fill displacements and types according to in-memory order in tuple
        // NOTE: the in-memory order is not necessarily the same as the order
        // of types as accessed by std::get
        // For gcc the order is actually reversed!
        // Hence, we use a std::map to collect the order information prior
        // to creating the displacement and type arrays
        std::array<MPI_Aint, size> displs;
        std::array<MPI_Datatype, size> mpitypes;
        std::size_t i = 0;
        for (std::map<MPI_Aint, MPI_Datatype>::iterator it = members.begin();
             it != members.end(); ++it) {
            displs[i] = it->first;
            mpitypes[i] = it->second;
            ++i;
        }

        // create type
        MPI_Datatype struct_type;
        MPI_Type_create_struct(size, blocklen, &displs[0], &mpitypes[0], &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(tuple_t), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);

        return _type;
    }